

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointcloud.cpp
# Opt level: O0

void __thiscall ON_PointCloud::Dump(ON_PointCloud *this,ON_TextLog *dump)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ON_3dPoint *p;
  ON_3dVector *p_00;
  ON_Color *color;
  bool *pbVar5;
  int point_count;
  bool bHasHiddenPoints;
  bool bHasColors;
  bool bHasNormals;
  int i;
  int half_max;
  ON_TextLog *dump_local;
  ON_PointCloud *this_local;
  
  bVar1 = HasPointNormals(this);
  bVar2 = HasPointColors(this);
  iVar3 = HiddenPointCount(this);
  uVar4 = ON_SimpleArray<ON_3dPoint>::Count(&(this->m_P).super_ON_SimpleArray<ON_3dPoint>);
  ON_TextLog::Print(dump,"ON_PointCloud: %d points\n",(ulong)uVar4);
  ON_TextLog::PushIndent(dump);
  for (point_count = 0; point_count < (int)uVar4; point_count = point_count + 1) {
    if ((point_count == 0x32) && (100 < (int)uVar4)) {
      ON_TextLog::Print(dump,"...\n");
      point_count = uVar4 - 0x32;
    }
    else {
      ON_TextLog::Print(dump,"point[%2d]: ",(ulong)(uint)point_count);
      p = ON_SimpleArray<ON_3dPoint>::operator[]
                    (&(this->m_P).super_ON_SimpleArray<ON_3dPoint>,point_count);
      ON_TextLog::Print(dump,p);
      if (bVar1) {
        ON_TextLog::Print(dump,", normal = ");
        p_00 = ON_SimpleArray<ON_3dVector>::operator[](&this->m_N,point_count);
        ON_TextLog::Print(dump,p_00);
      }
      if (bVar2) {
        ON_TextLog::Print(dump,", color = ");
        color = ON_SimpleArray<ON_Color>::operator[](&this->m_C,point_count);
        ON_TextLog::PrintRGB(dump,color);
      }
      if (0 < iVar3) {
        pbVar5 = ON_SimpleArray<bool>::operator[](&this->m_H,point_count);
        if ((*pbVar5 & 1U) != 0) {
          ON_TextLog::Print(dump," (hidden)");
        }
      }
      ON_TextLog::Print(dump,"\n");
    }
  }
  ON_TextLog::PopIndent(dump);
  return;
}

Assistant:

void ON_PointCloud::Dump( ON_TextLog& dump ) const
{
  // Aug 23, 2016 Tim - Fix for RH-35351
  // half_max is arbitrary, if you want more than 100 points 
  // change it to your liking. This is to prevent all of the 
  // points from displaying when you have a very large point 
  // cloud, like a billion. (see model on RH-35348)
  const int half_max = 50;

  int i;
  const bool bHasNormals = HasPointNormals();
  const bool bHasColors = HasPointColors();
  const bool bHasHiddenPoints = (HiddenPointCount() > 0);
  const int point_count = m_P.Count();
  dump.Print("ON_PointCloud: %d points\n",point_count);
  dump.PushIndent();
  for ( i = 0; i < point_count; i++ ) 
  {
    if (i == half_max && 2 * half_max < point_count)
    {
      dump.Print("...\n");
      i = point_count - half_max;
    }
    else
    {
      dump.Print("point[%2d]: ", i);
      dump.Print(m_P[i]);
      if (bHasNormals)
      {
        dump.Print(", normal = ");
        dump.Print(m_N[i]);
      }
      if (bHasColors)
      {
        dump.Print(", color = ");
        dump.PrintRGB(m_C[i]);
      }
      if (bHasHiddenPoints && m_H[i])
      {
        dump.Print(" (hidden)");
      }
      dump.Print("\n");
    }
  }
  dump.PopIndent();
}